

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_concat(lua_State *L,int total)

{
  StkId pTVar1;
  StkId pTVar2;
  bool bVar3;
  ulong local_a8;
  TString *local_98;
  TString *x_;
  TValue *io;
  char buff [40];
  size_t l;
  TString *ts;
  size_t tl;
  TValue *io2;
  TValue *io1;
  int n;
  StkId top;
  int total_local;
  lua_State *L_local;
  
  top._4_4_ = total;
  if (total < 2) {
    __assert_fail("total >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x326,"void luaV_concat(lua_State *, int)");
  }
  do {
    pTVar2 = L->top;
    io1._4_4_ = 2;
    if (((pTVar2[-2].tt_ & 0xf) == 4) || ((pTVar2[-2].tt_ & 0xf) == 3)) {
      if ((pTVar2[-1].tt_ & 0xf) != 4) {
        if ((pTVar2[-1].tt_ & 0xf) != 3) goto LAB_00140c85;
        luaO_tostring(L,pTVar2 + -1);
      }
      if (pTVar2[-1].tt_ == 0x8004) {
        if ((pTVar2[-1].tt_ & 0xf) != 4) {
          __assert_fail("(((((((top - 1))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32c,"void luaV_concat(lua_State *, int)");
        }
        if (((pTVar2[-1].value_.gc)->tt & 0xf) != 4) {
          __assert_fail("(((((top - 1)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32c,"void luaV_concat(lua_State *, int)");
        }
        if (pTVar2[-1].value_.f[0xb] == (_func_int_lua_State_ptr)0x0) {
          if (((pTVar2[-2].tt_ & 0xf) != 4) && ((pTVar2[-2].tt_ & 0xf) == 3)) {
            luaO_tostring(L,pTVar2 + -2);
          }
          goto LAB_001415a1;
        }
      }
      if (pTVar2[-2].tt_ == 0x8004) {
        if ((pTVar2[-2].tt_ & 0xf) != 4) {
          __assert_fail("(((((((top - 2))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32e,"void luaV_concat(lua_State *, int)");
        }
        if (((pTVar2[-2].value_.gc)->tt & 0xf) != 4) {
          __assert_fail("(((((top - 2)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32e,"void luaV_concat(lua_State *, int)");
        }
        if (pTVar2[-2].value_.f[0xb] == (_func_int_lua_State_ptr)0x0) {
          pTVar1 = pTVar2 + -2;
          pTVar1->value_ = pTVar2[-1].value_;
          pTVar2[-2].tt_ = pTVar2[-1].tt_;
          if ((pTVar2[-2].tt_ & 0x8000) != 0) {
            if ((pTVar2[-2].tt_ & 0x8000) == 0) {
              __assert_fail("(((io1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0x32f,"void luaV_concat(lua_State *, int)");
            }
            if ((pTVar2[-2].tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00140f2b:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0x32f,"void luaV_concat(lua_State *, int)");
            }
            if (L != (lua_State *)0x0) {
              if ((pTVar2[-2].tt_ & 0x8000) == 0) {
                __assert_fail("(((io1)->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                              ,0x32f,"void luaV_concat(lua_State *, int)");
              }
              if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
              goto LAB_00140f2b;
            }
          }
          goto LAB_001415a1;
        }
      }
      if ((pTVar2[-1].tt_ & 0xf) != 4) {
        __assert_fail("(((((((top - 1))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x333,"void luaV_concat(lua_State *, int)");
      }
      if (((pTVar2[-1].value_.gc)->tt & 0xf) != 4) {
        __assert_fail("(((((top - 1)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x333,"void luaV_concat(lua_State *, int)");
      }
      if ((pTVar2[-1].value_.gc)->tt == '\x04') {
        if ((pTVar2[-1].tt_ & 0xf) != 4) {
          __assert_fail("(((((((top - 1))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x333,"void luaV_concat(lua_State *, int)");
        }
        if (((pTVar2[-1].value_.gc)->tt & 0xf) != 4) {
          __assert_fail("(((((top - 1)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x333,"void luaV_concat(lua_State *, int)");
        }
        local_98 = (TString *)(ulong)(byte)pTVar2[-1].value_.f[0xb];
      }
      else {
        if ((pTVar2[-1].tt_ & 0xf) != 4) {
          __assert_fail("(((((((top - 1))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x333,"void luaV_concat(lua_State *, int)");
        }
        if (((pTVar2[-1].value_.gc)->tt & 0xf) != 4) {
          __assert_fail("(((((top - 1)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x333,"void luaV_concat(lua_State *, int)");
        }
        local_98 = *(TString **)(pTVar2[-1].value_.f + 0x10);
      }
      ts = local_98;
      io1._4_4_ = 1;
      while( true ) {
        bVar3 = false;
        if (((io1._4_4_ < top._4_4_) &&
            (bVar3 = true, (pTVar2[-1 - (long)io1._4_4_].tt_ & 0xf) != 4)) &&
           (bVar3 = (pTVar2[-1 - (long)io1._4_4_].tt_ & 0xf) == 3, bVar3)) {
          luaO_tostring(L,pTVar2 + (-1 - (long)io1._4_4_));
        }
        if (!bVar3) break;
        if ((pTVar2[-1 - (long)io1._4_4_].tt_ & 0xf) != 4) {
          __assert_fail("(((((((top - n - 1))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x337,"void luaV_concat(lua_State *, int)");
        }
        if (((pTVar2[-1 - (long)io1._4_4_].value_.gc)->tt & 0xf) != 4) {
          __assert_fail("(((((top - n - 1)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x337,"void luaV_concat(lua_State *, int)");
        }
        if ((pTVar2[-1 - (long)io1._4_4_].value_.gc)->tt == '\x04') {
          if ((pTVar2[-1 - (long)io1._4_4_].tt_ & 0xf) != 4) {
            __assert_fail("(((((((top - n - 1))->tt_)) & 0x0F)) == (4))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x337,"void luaV_concat(lua_State *, int)");
          }
          if (((pTVar2[-1 - (long)io1._4_4_].value_.gc)->tt & 0xf) != 4) {
            __assert_fail("(((((top - n - 1)->value_).gc)->tt) & 0x0F) == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x337,"void luaV_concat(lua_State *, int)");
          }
          local_a8 = (ulong)(byte)pTVar2[-1 - (long)io1._4_4_].value_.f[0xb];
        }
        else {
          if ((pTVar2[-1 - (long)io1._4_4_].tt_ & 0xf) != 4) {
            __assert_fail("(((((((top - n - 1))->tt_)) & 0x0F)) == (4))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x337,"void luaV_concat(lua_State *, int)");
          }
          if (((pTVar2[-1 - (long)io1._4_4_].value_.gc)->tt & 0xf) != 4) {
            __assert_fail("(((((top - n - 1)->value_).gc)->tt) & 0x0F) == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x337,"void luaV_concat(lua_State *, int)");
          }
          local_a8 = *(ulong *)(pTVar2[-1 - (long)io1._4_4_].value_.f + 0x10);
        }
        buff[0x20] = (undefined1)local_a8;
        buff[0x21] = local_a8._1_1_;
        buff[0x22] = local_a8._2_1_;
        buff[0x23] = local_a8._3_1_;
        buff[0x24] = local_a8._4_1_;
        buff[0x25] = local_a8._5_1_;
        buff[0x26] = local_a8._6_1_;
        buff[0x27] = local_a8._7_1_;
        if (0x7fffffffffffffffU - (long)ts <= local_a8) {
          luaG_runerror(L,"string length overflow");
        }
        ts = (TString *)((long)&ts->next + local_a8);
        io1._4_4_ = io1._4_4_ + 1;
        buff._32_8_ = local_a8;
      }
      if (ts < (TString *)0x29) {
        copy2buff(pTVar2,io1._4_4_,(char *)&io);
        l = (size_t)luaS_newlstr(L,(char *)&io,(size_t)ts);
      }
      else {
        l = (size_t)luaS_createlngstrobj(L,(size_t)ts);
        copy2buff(pTVar2,io1._4_4_,(char *)(l + 0x18));
      }
      pTVar2 = pTVar2 + -(long)io1._4_4_;
      if (9 < (*(byte *)(l + 8) & 0xf)) {
        __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x345,"void luaV_concat(lua_State *, int)");
      }
      (pTVar2->value_).i = l;
      pTVar2->tt_ = *(byte *)(l + 8) | 0x8000;
      if ((pTVar2->tt_ & 0x8000) != 0) {
        if ((pTVar2->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x345,"void luaV_concat(lua_State *, int)");
        }
        if ((pTVar2->tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_0014157c:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x345,"void luaV_concat(lua_State *, int)");
        }
        if (L != (lua_State *)0x0) {
          if ((pTVar2->tt_ & 0x8000) == 0) {
            __assert_fail("(((io)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x345,"void luaV_concat(lua_State *, int)");
          }
          if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_0014157c;
        }
      }
    }
    else {
LAB_00140c85:
      luaT_trybinTM(L,pTVar2 + -2,pTVar2 + -1,pTVar2 + -2,TM_CONCAT);
    }
LAB_001415a1:
    top._4_4_ = top._4_4_ - (io1._4_4_ + -1);
    L->top = L->top + -(long)(io1._4_4_ + -1);
    if (top._4_4_ < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || cvt2str(top-2)) || !tostring(L, top-1))
      luaT_trybinTM(L, top-2, top-1, top-2, TM_CONCAT);
    else if (isemptystr(top - 1))  /* second operand is empty? */
      cast_void(tostring(L, top - 2));  /* result is first operand */
    else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = vslen(top - 1);
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, top - n - 1); n++) {
        size_t l = vslen(top - n - 1);
        if (unlikely(l >= (MAX_SIZE/sizeof(char)) - tl))
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}